

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

void Gia_ManSpecReduceInit_rec
               (Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vXorLits,int f,int fDualOut)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  pGVar2 = p->pObjs;
  if ((pGVar2 <= pObj) && (pObj < pGVar2 + p->nObjs)) {
    uVar8 = (int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555 + p->nObjs * f;
    if (((int)uVar8 < 0) || ((p->vCopies).nSize <= (int)uVar8)) {
LAB_002015b6:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if ((p->vCopies).pArray[uVar8] != -1) {
      return;
    }
    if (((int)(uint)*(undefined8 *)pObj < 0) ||
       (uVar8 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar8 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                    ,0x51f,
                    "void Gia_ManSpecReduceInit_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int, int)"
                   );
    }
    Gia_ManSpecReduceInit_rec(pNew,p,pObj + -(ulong)uVar8,vXorLits,f,fDualOut);
    Gia_ManSpecReduceInit_rec
              (pNew,p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),vXorLits,f,fDualOut);
    uVar3 = *(ulong *)pObj;
    pGVar2 = pObj + -(uVar3 & 0x1fffffff);
    pGVar4 = p->pObjs;
    if (pGVar4 <= pGVar2) {
      if (pGVar2 < pGVar4 + p->nObjs) {
        iVar6 = p->nObjs * f;
        uVar8 = (int)((ulong)((long)pGVar2 - (long)pGVar4) >> 2) * -0x55555555 + iVar6;
        if (((int)uVar8 < 0) || (uVar1 = (p->vCopies).nSize, (int)uVar1 <= (int)uVar8))
        goto LAB_002015b6;
        piVar5 = (p->vCopies).pArray;
        uVar8 = piVar5[uVar8];
        if ((int)uVar8 < 0) {
LAB_002015f4:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar9 = (uint)(uVar3 >> 0x20);
        pGVar2 = pObj + -(ulong)(uVar9 & 0x1fffffff);
        if ((pGVar4 <= pGVar2) && (pGVar2 < pGVar4 + p->nObjs)) {
          uVar7 = iVar6 + (int)((ulong)((long)pGVar2 - (long)pGVar4) >> 2) * -0x55555555;
          if (((int)uVar7 < 0) || (uVar1 <= uVar7)) goto LAB_002015b6;
          uVar1 = piVar5[uVar7];
          if ((int)uVar1 < 0) goto LAB_002015f4;
          iVar6 = Gia_ManHashAnd(pNew,uVar8 ^ (uint)(uVar3 >> 0x1d) & 1,uVar1 ^ uVar9 >> 0x1d & 1);
          pGVar2 = p->pObjs;
          if ((pGVar2 <= pObj) && (pObj < pGVar2 + p->nObjs)) {
            uVar8 = (int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555 + p->nObjs * f;
            if ((-1 < (int)uVar8) && ((int)uVar8 < (p->vCopies).nSize)) {
              (p->vCopies).pArray[uVar8] = iVar6;
              Gia_ManSpecBuildInit(pNew,p,pObj,vXorLits,f,fDualOut);
              return;
            }
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
        }
      }
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManSpecReduceInit_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vXorLits, int f, int fDualOut )
{
    if ( ~Gia_ObjCopyF(p, f, pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManSpecReduceInit_rec( pNew, p, Gia_ObjFanin0(pObj), vXorLits, f, fDualOut );
    Gia_ManSpecReduceInit_rec( pNew, p, Gia_ObjFanin1(pObj), vXorLits, f, fDualOut );
    Gia_ObjSetCopyF( p, f, pObj, Gia_ManHashAnd(pNew, Gia_ObjFanin0CopyF(p, f, pObj), Gia_ObjFanin1CopyF(p, f, pObj)) );
    Gia_ManSpecBuildInit( pNew, p, pObj, vXorLits, f, fDualOut );
}